

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O0

ImWchar * ImGuiStb::stb_text_createundo(StbUndoState *state,int pos,int insert_len,int delete_len)

{
  StbUndoRecord *pSVar1;
  StbUndoRecord *r;
  int delete_len_local;
  int insert_len_local;
  int pos_local;
  StbUndoState *state_local;
  
  pSVar1 = stb_text_create_undo_record(state,insert_len);
  if (pSVar1 == (StbUndoRecord *)0x0) {
    state_local = (StbUndoState *)0x0;
  }
  else {
    pSVar1->where = pos;
    pSVar1->insert_length = (short)insert_len;
    pSVar1->delete_length = (short)delete_len;
    if (insert_len == 0) {
      pSVar1->char_storage = -1;
      state_local = (StbUndoState *)0x0;
    }
    else {
      pSVar1->char_storage = state->undo_char_point;
      state->undo_char_point = state->undo_char_point + (short)insert_len;
      state_local = (StbUndoState *)(state->undo_char + pSVar1->char_storage);
    }
  }
  return (ImWchar *)state_local;
}

Assistant:

static STB_TEXTEDIT_CHARTYPE *stb_text_createundo(StbUndoState *state, int pos, int insert_len, int delete_len)
{
   StbUndoRecord *r = stb_text_create_undo_record(state, insert_len);
   if (r == NULL)
      return NULL;

   r->where = pos;
   r->insert_length = (short) insert_len;
   r->delete_length = (short) delete_len;

   if (insert_len == 0) {
      r->char_storage = -1;
      return NULL;
   } else {
      r->char_storage = state->undo_char_point;
      state->undo_char_point = state->undo_char_point + (short) insert_len;
      return &state->undo_char[r->char_storage];
   }
}